

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapParser.cpp
# Opt level: O0

bool rc::detail::anon_unknown_0::parsePair
               (ParseState *s0,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *pair)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  void *extraout_RDX;
  void *pvVar4;
  string local_58 [40];
  undefined1 local_30 [8];
  ParseState s1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_local;
  ParseState *s0_local;
  
  local_30 = (undefined1  [8])s0->str;
  s1.str = (string *)s0->pos;
  s1.pos = (size_type)pair;
  skipSpace((ParseState *)local_30);
  pvVar4 = (void *)s1.pos;
  (anonymous_namespace)::
  parseString<rc::detail::(anonymous_namespace)::parsePair(rc::detail::ParseState&,std::pair<std::__cxx11::string,std::__cxx11::string>&)::__0>
            (local_30);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    skipSpace((ParseState *)local_30);
    bVar1 = ParseState::end((ParseState *)local_30);
    if ((bVar1) ||
       (iVar2 = ParseState::c((ParseState *)local_30,pvVar4,extraout_RDX), (char)iVar2 != '=')) {
      std::__cxx11::string::string(local_58);
      std::__cxx11::string::operator=((string *)(s1.pos + 0x20),local_58);
      std::__cxx11::string::~string(local_58);
    }
    else {
      s1.str = (string *)&(s1.str)->field_0x1;
      skipSpace((ParseState *)local_30);
      (anonymous_namespace)::
      parseString<rc::detail::(anonymous_namespace)::parsePair(rc::detail::ParseState&,std::pair<std::__cxx11::string,std::__cxx11::string>&)::__1>
                (local_30,s1.pos + 0x20);
    }
    s0->str = (string *)local_30;
    s0->pos = (size_type)s1.str;
    return true;
  }
  return false;
}

Assistant:

bool parsePair(ParseState &s0, std::pair<std::string, std::string> &pair) {
  ParseState s1(s0);
  skipSpace(s1);
  parseString(s1,
              pair.first,
              [](char c) {
                return (c != '=') && !std::isspace(c, std::locale::classic());
              });
  if (pair.first.empty()) {
    return false;
  }

  skipSpace(s1);
  if (s1.end() || (s1.c() != '=')) {
    // Have no value, but that's okay, set to empty.
    pair.second = std::string();
  } else {
    // Have value, parse it.
    s1.pos++;
    skipSpace(s1);
    parseString(
        s1,
        pair.second,
        [](char c) { return !std::isspace(c, std::locale::classic()); });
  }

  s0 = s1;
  return true;
}